

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  UnaryOperator UVar1;
  ForLoopStatement *args_3;
  bool bVar2;
  int iVar3;
  SyntaxNode *pSVar4;
  Scope *this;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Expression *pEVar6;
  undefined4 extraout_var_01;
  UnaryExpression *pUVar7;
  StatementSyntax *pSVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  CompilationOptions *pCVar9;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  bool bVar10;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  undefined1 local_4f0 [8];
  UnrollVisitor visitor;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> local_280;
  SourceRange local_270;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_260;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_250;
  Compilation *local_240;
  ForLoopStatement *result;
  Statement *bodyStmt;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_Statements_h:168:37)>
  guard;
  bool wasFirst;
  UnaryOperator op;
  bool stepOk;
  bitmask<slang::ast::ASTFlags> local_1d8;
  Expression *local_1d0;
  Expression *expr;
  ExpressionSyntax *step;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  Expression *local_150;
  Expression *stopExpr;
  bitmask<slang::ast::ASTFlags> local_140;
  Expression *local_138;
  Expression *init;
  SyntaxNode *initializer;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *__range3_1;
  VariableSymbol *local_f8;
  VariableSymbol *var;
  specific_symbol_iterator<slang::ast::VariableSymbol> __end3;
  specific_symbol_iterator<slang::ast::VariableSymbol> __begin3;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> *__range3
  ;
  bool local_b1;
  undefined1 local_b0 [6];
  bool hasVarDecls;
  bool anyBad;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  StatementContext *stmtCtx_local;
  ASTContext *context_local;
  ForLoopStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)(loopVars.stackBase + 0x18));
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::VariableSymbol_*,_5UL> *)local_b0);
  local_b1 = false;
  bVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::empty
                    (&syntax->initializers);
  bVar10 = false;
  if (!bVar2) {
    pSVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                       (&syntax->initializers,0);
    bVar10 = pSVar4->kind == ForVariableDeclaration;
  }
  if (bVar10) {
    this = not_null<const_slang::ast::Scope_*>::operator->(&context->scope);
    iVar11 = Scope::membersOfType<slang::ast::VariableSymbol>(this);
    __begin3 = iVar11.m_begin.current;
    __end3 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
             ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
                      *)&__begin3);
    var = (VariableSymbol *)
          iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>::
          end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
               *)&__begin3);
    while( true ) {
      bVar10 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_std::forward_iterator_tag,_const_slang::ast::VariableSymbol,_long,_const_slang::ast::VariableSymbol_*,_const_slang::ast::VariableSymbol_&>
               ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_std::forward_iterator_tag,_const_slang::ast::VariableSymbol,_long,_const_slang::ast::VariableSymbol_*,_const_slang::ast::VariableSymbol_&>
                             *)&__end3,(specific_symbol_iterator<slang::ast::VariableSymbol> *)&var)
      ;
      if (!bVar10) break;
      __range3_1 = (SeparatedSyntaxList<slang::syntax::SyntaxNode> *)
                   Scope::specific_symbol_iterator<slang::ast::VariableSymbol>::operator*(&__end3);
      local_f8 = (VariableSymbol *)__range3_1;
      SmallVectorBase<const_slang::ast::VariableSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::VariableSymbol_*> *)local_b0,
                 (VariableSymbol **)&__range3_1);
      Scope::specific_symbol_iterator<slang::ast::VariableSymbol>::operator++(&__end3);
    }
  }
  else {
    cVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::begin
                       (&syntax->initializers);
    __end3_1.index = (size_t)cVar12.list;
    cVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::end
                       (&syntax->initializers);
    while( true ) {
      __end3_1.list = (ParentList *)cVar12.index;
      initializer = (SyntaxNode *)cVar12.list;
      bVar10 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
               ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
                             *)&__end3_1.index,
                            (iterator_base<const_slang::syntax::SyntaxNode_*> *)&initializer);
      if (!bVar10) break;
      init = (Expression *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::
             iterator_base<const_slang::syntax::SyntaxNode_*>::operator*
                       ((iterator_base<const_slang::syntax::SyntaxNode_*> *)&__end3_1.index);
      pEVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>((SyntaxNode *)init);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_140,AssignmentAllowed);
      iVar3 = Expression::bind((int)pEVar5,(sockaddr *)context,(socklen_t)local_140.m_bits);
      stopExpr = (Expression *)CONCAT44(extraout_var,iVar3);
      local_138 = stopExpr;
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)(loopVars.stackBase + 0x18),
                 &stopExpr);
      bVar10 = Expression::bad(local_138);
      local_b1 = local_b1 != false || bVar10;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_std::random_access_iterator_tag,_const_slang::syntax::SyntaxNode_*,_unsigned_long,_const_slang::syntax::SyntaxNode_**,_const_slang::syntax::SyntaxNode_*&>
                    *)&__end3_1.index);
      cVar12.index = (size_t)__end3_1.list;
      cVar12.list = (ParentList *)initializer;
    }
  }
  local_150 = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    pEVar5 = syntax->stopExpr;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)(steps.stackBase + 0x18),None);
    iVar3 = Expression::bind((int)pEVar5,(sockaddr *)context,steps.stackBase._24_4_);
    local_150 = (Expression *)CONCAT44(extraout_var_00,iVar3);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
  cVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                     (&syntax->steps);
  __end2.index = (size_t)cVar13.list;
  cVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&syntax->steps);
  while( true ) {
    __end2.list = (ParentList *)cVar13.index;
    step = (ExpressionSyntax *)cVar13.list;
    bVar10 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
             ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
                           *)&__end2.index,
                          (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&step);
    if (!bVar10) break;
    pEVar6 = (Expression *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<const_slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    expr = pEVar6;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1d8,AssignmentAllowed);
    iVar3 = Expression::bind((int)pEVar6,(sockaddr *)context,(socklen_t)local_1d8.m_bits);
    _op = (Expression *)CONCAT44(extraout_var_01,iVar3);
    local_1d0 = _op;
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,(Expression **)&op);
    bVar10 = Expression::bad(local_1d0);
    local_b1 = (bool)(local_b1 | bVar10);
    switch(local_1d0->kind) {
    case Invalid:
    case Assignment:
    case Call:
      bVar10 = true;
      break;
    default:
      bVar10 = false;
      break;
    case UnaryOp:
      pUVar7 = Expression::as<slang::ast::UnaryExpression>(local_1d0);
      UVar1 = pUVar7->op;
      bVar10 = true;
      if (((UVar1 != Preincrement) && (bVar10 = true, UVar1 != Postincrement)) &&
         (bVar10 = true, UVar1 != Predecrement)) {
        bVar10 = UVar1 == Postdecrement;
      }
    }
    if (!bVar10) {
      local_b1 = true;
      ASTContext::addDiag(context,(DiagCode)0x1f0008,local_1d0->sourceRange);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
    cVar13.index = (size_t)__end2.list;
    cVar13.list = (ParentList *)step;
  }
  if ((local_b1 != false) ||
     ((local_150 != (Expression *)0x0 && (bVar10 = Expression::bad(local_150), bVar10)))) {
    compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)0x0);
  }
  else {
    bitmask<slang::ast::StatementFlags>::bitmask
              ((bitmask<slang::ast::StatementFlags> *)&guard.field_0x14,InForLoop);
    bVar10 = bitmask<slang::ast::StatementFlags>::has
                       (&stmtCtx->flags,(bitmask<slang::ast::StatementFlags> *)&guard.field_0x14);
    Statement::StatementContext::enterLoop
              ((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_Statements_h:168:37)>
                *)&bodyStmt,stmtCtx,true);
    pSVar8 = not_null<slang::syntax::StatementSyntax_*>::operator*(&syntax->statement);
    iVar3 = Statement::bind((int)pSVar8,(sockaddr *)context,(socklen_t)stmtCtx);
    result = (ForLoopStatement *)CONCAT44(extraout_var_02,iVar3);
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)
                       (loopVars.stackBase + 0x18),(EVP_PKEY_CTX *)compilation,src);
    local_250.data_ = (pointer)CONCAT44(extraout_var_03,iVar3);
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,
                       (EVP_PKEY_CTX *)compilation,src_00);
    args_3 = result;
    local_260.data_ = (pointer)CONCAT44(extraout_var_04,iVar3);
    local_270 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    local_240 = (Compilation *)
                BumpAllocator::
                emplace<slang::ast::ForLoopStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                          (&compilation->super_BumpAllocator,&local_250,&local_150,&local_260,
                           &args_3->super_Statement,&local_270);
    visitor.evalCtx.disableRange.endLoc._0_4_ =
         SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                   ((SmallVectorBase<const_slang::ast::VariableSymbol_*> *)local_b0,
                    (EVP_PKEY_CTX *)compilation,src_01);
    visitor.evalCtx.disableRange.endLoc._4_4_ = extraout_var_05;
    nonstd::span_lite::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL,_0>
              (&local_280,
               (span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL> *)
               &visitor.evalCtx.disableRange.endLoc);
    *(pointer *)&(local_240->options).typoCorrectionLimit = local_280.data_;
    (local_240->options).allowHierarchicalConst = (bool)(undefined1)local_280.size_;
    (local_240->options).relaxEnumConversions = (bool)local_280.size_._1_1_;
    (local_240->options).allowDupInitialDrivers = (bool)local_280.size_._2_1_;
    (local_240->options).strictDriverChecking = (bool)local_280.size_._3_1_;
    (local_240->options).lintMode = (bool)local_280.size_._4_1_;
    (local_240->options).suppressUnused = (bool)local_280.size_._5_1_;
    *(undefined2 *)&(local_240->options).field_0x2e = local_280.size_._6_2_;
    bVar2 = Statement::bad(&result->super_Statement);
    if (bVar2) {
      compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)local_240);
    }
    else {
      if (!bVar10) {
        pCVar9 = Compilation::getOptions(compilation);
        if ((pCVar9->strictDriverChecking & 1U) == 0) {
          UnrollVisitor::UnrollVisitor((UnrollVisitor *)local_4f0,context);
          ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ForLoopStatement>
                    ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)local_4f0,
                     (ForLoopStatement *)local_240);
          UnrollVisitor::~UnrollVisitor((UnrollVisitor *)local_4f0);
        }
      }
      compilation_local = local_240;
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Statements.h:168:37)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_Statements_h:168:37)>
                   *)&bodyStmt);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::VariableSymbol_*,_5UL> *)local_b0);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)(loopVars.stackBase + 0x18));
  return (Statement *)compilation_local;
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.getOptions().strictDriverChecking) {
        UnrollVisitor visitor(context);
        visitor.visit(*result);
    }

    return *result;
}